

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void __thiscall deqp::egl::anon_unknown_1::ShadersOOB::teardown(ShadersOOB *this)

{
  glDeleteBuffersFunc p_Var1;
  bool bVar2;
  GLenum GVar3;
  deBool dVar4;
  size_type sVar5;
  reference pvVar6;
  ShadersOOB *this_local;
  
  if (((this->super_ContextReset).m_shaderType != SHADERTYPE_COMPUTE) &&
     (this->m_coordLocation != 0)) {
    do {
      (*((this->super_ContextReset).m_gl)->disableVertexAttribArray)(this->m_coordLocation);
      GVar3 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar3,"disableVertexAttribArray(m_coordLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x552);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    this->m_coordLocation = 0;
  }
  if (this->m_coordinatesBuffer != 0) {
    do {
      (*((this->super_ContextReset).m_gl)->deleteBuffers)(1,&this->m_coordinatesBuffer);
      GVar3 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar3,"deleteBuffers(1, &m_coordinatesBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x559);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    this->m_coordinatesBuffer = 0;
  }
  if (((this->m_isLocalArray & 1U) == 0) &&
     (bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->m_buffers),
     !bVar2)) {
    do {
      p_Var1 = ((this->super_ContextReset).m_gl)->deleteBuffers;
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_buffers);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_buffers,0);
      (*p_Var1)((GLsizei)sVar5,pvVar6);
      GVar3 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar3,"deleteBuffers((glw::GLsizei)m_buffers.size(), &m_buffers[0])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x561);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_buffers);
  }
  do {
    (*((this->super_ContextReset).m_gl)->useProgram)(0);
    GVar3 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar3,"useProgram(0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x566);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  return;
}

Assistant:

void ShadersOOB::teardown (void)
{
	if (m_shaderType != SHADERTYPE_COMPUTE)
	{
		if (m_coordLocation)
		{
			GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(m_coordLocation));
			m_coordLocation = 0;
		}
	}

	if (m_coordinatesBuffer)
	{
		GLU_CHECK_GLW_CALL(m_gl, deleteBuffers(1, &m_coordinatesBuffer));
		m_coordinatesBuffer = 0;
	}

	if (!m_isLocalArray)
	{
		if (!m_buffers.empty())
		{
			GLU_CHECK_GLW_CALL(m_gl, deleteBuffers((glw::GLsizei)m_buffers.size(), &m_buffers[0]));
			m_buffers.clear();
		}
	}

	GLU_CHECK_GLW_CALL(m_gl, useProgram(0));
}